

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
* __thiscall
mjs::parser::parse_function_abi_cxx11_
          (tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
           *__return_storage_ptr__,parser *this)

{
  pointer *__return_storage_ptr___00;
  pointer *this_00;
  uint32_t uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  wstring *__x;
  syntax_node *this_01;
  source_extend *psVar6;
  pointer psVar7;
  block_statement *this_02;
  size_type sVar8;
  reference pvVar9;
  wostream *pwVar10;
  reference pvVar11;
  char *pcVar12;
  wchar_t *in_R9;
  wstring_view name;
  undefined1 auVar13 [16];
  wstring_view message;
  wstring_view message_00;
  source_extend local_560;
  wstring local_548 [32];
  undefined1 local_528 [16];
  wostringstream local_518 [8];
  wostringstream _oss_1;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_3a0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_398;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_390;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_388;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_380;
  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_378;
  wstring local_370 [32];
  undefined1 local_350 [16];
  mjs local_340 [16];
  wstring local_330;
  wostringstream local_310 [8];
  wostringstream _oss;
  undefined1 local_188 [8];
  value_type n;
  size_t i;
  undefined1 local_158 [4];
  uint32_t body_end;
  statement_ptr block;
  scoped_strict_mode ssm;
  undefined1 local_118 [80];
  source_extend local_c8;
  undefined1 local_a0 [48];
  vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> param_extends;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  params;
  uint32_t body_start;
  parser *this_local;
  
  uVar4 = lexer::text_position(&this->lexer_);
  pcVar12 = "parse_function";
  __return_storage_ptr___00 =
       &params.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  expect((token *)__return_storage_ptr___00,this,lparen,"parse_function",0x288);
  token::~token((token *)__return_storage_ptr___00);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)&param_extends.
               super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::vector
            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)(local_a0 + 0x28));
  accept((parser *)local_a0,(int)this,(sockaddr *)0x2f,(socklen_t *)pcVar12);
  bVar3 = token::operator_cast_to_bool((token *)local_a0);
  token::~token((token *)local_a0);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    do {
      current_extend(&local_c8,this);
      std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::push_back
                ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)
                 (local_a0 + 0x28),&local_c8);
      source_extend::~source_extend(&local_c8);
      pcVar12 = "parse_function";
      expect((token *)(local_118 + 0x28),this,identifier,"parse_function",0x28e);
      __x = token::text_abi_cxx11_((token *)(local_118 + 0x28));
      std::
      vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)&param_extends.
                      super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      token::~token((token *)(local_118 + 0x28));
      accept((parser *)local_118,(int)this,(sockaddr *)0x20,(socklen_t *)pcVar12);
      bVar3 = token::operator_cast_to_bool((token *)local_118);
      token::~token((token *)local_118);
    } while (bVar3);
    expect((token *)&ssm.strict_before_,this,rparen,"parse_function",0x290);
    token::~token((token *)&ssm.strict_before_);
  }
  scoped_strict_mode::scoped_strict_mode((scoped_strict_mode *)&block,this);
  parse_block((parser *)local_158,SUB81(this,0));
  this_01 = &std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                       ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                        local_158)->super_syntax_node;
  psVar6 = syntax_node::extend(this_01);
  uVar1 = psVar6->end;
  psVar7 = std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator->
                     ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_158)
  ;
  iVar5 = (*(psVar7->super_syntax_node)._vptr_syntax_node[3])();
  if (iVar5 != 0) {
    __assert_fail("block->type() == statement_type::block",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x296,"auto mjs::parser::parse_function()");
  }
  this_02 = (block_statement *)
            std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::operator*
                      ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_158
                      );
  bVar3 = block_statement::strict_mode(this_02);
  if ((bVar3) && ((this->skip_strict_checks_for_first_function_ & 1U) == 0)) {
    for (n.field_2._8_8_ = 0; uVar2 = n.field_2._8_8_,
        sVar8 = std::
                vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                ::size((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                        *)&param_extends.
                           super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage), (ulong)uVar2 < sVar8
        ; n.field_2._8_8_ = n.field_2._8_8_ + 1) {
      pvVar9 = std::
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                             *)&param_extends.
                                super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,n.field_2._8_8_);
      std::__cxx11::wstring::wstring((wstring *)local_188,(wstring *)pvVar9);
      auVar13 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_188);
      name._M_str = auVar13._8_8_;
      name._M_len = (size_t)name._M_str;
      bVar3 = is_strict_mode_unassignable_identifier(auVar13._0_8_,name);
      if (bVar3) {
        std::__cxx11::wostringstream::wostringstream(local_310);
        pwVar10 = std::operator<<((wostream *)local_310,"\"");
        local_340 = (mjs  [16])
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_188);
        cpp_quote_abi_cxx11_(&local_330,local_340,local_340._8_8_);
        pwVar10 = std::operator<<(pwVar10,(wstring *)&local_330);
        std::operator<<(pwVar10,"\" may not be used as a parameter name in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_330);
        pvVar11 = std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::operator[]
                            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)
                             (local_a0 + 0x28),n.field_2._8_8_);
        std::__cxx11::wostringstream::str();
        local_350 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_370);
        message._M_str = in_R9;
        message._M_len = local_350._8_8_;
        syntax_error((parser *)"parse_function",(char *)0x29b,(int)pvVar11,local_350._0_8_,message);
      }
      this_00 = &param_extends.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      local_390._M_current =
           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    *)this_00);
      local_388 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                  ::operator+(&local_390,n.field_2._8_8_);
      local_380 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                  ::operator+(&local_388,1);
      local_398 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                  std::
                  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)this_00);
      local_378 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::wstring*,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>>,std::__cxx11::wstring>
                            (local_380,
                             (__normal_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                              )local_398,
                             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                              *)local_188);
      local_3a0._M_current =
           (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)&param_extends.
                     super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = __gnu_cxx::operator!=(&local_378,&local_3a0);
      if (bVar3) {
        std::__cxx11::wostringstream::wostringstream(local_518);
        std::operator<<((wostream *)local_518,"Parameter names may not be repeated in strict mode");
        pvVar11 = std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::operator[]
                            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)
                             (local_a0 + 0x28),n.field_2._8_8_);
        std::__cxx11::wostringstream::str();
        local_528 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_548);
        message_00._M_str = in_R9;
        message_00._M_len = local_528._8_8_;
        syntax_error((parser *)"parse_function",(char *)0x29e,(int)pvVar11,local_528._0_8_,
                     message_00);
      }
      std::__cxx11::wstring::~wstring((wstring *)local_188);
    }
  }
  this->skip_strict_checks_for_first_function_ = false;
  std::shared_ptr<mjs::source_file>::shared_ptr(&local_560.file,&this->source_);
  local_560.start = uVar4 - 1;
  local_560.end = uVar1;
  std::
  make_tuple<mjs::source_extend,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
            (__return_storage_ptr__,&local_560,
             (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)&param_extends.
                 super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,
             (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_158);
  source_extend::~source_extend(&local_560);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::~unique_ptr
            ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_158);
  scoped_strict_mode::~scoped_strict_mode((scoped_strict_mode *)&block);
  std::vector<mjs::source_extend,_std::allocator<mjs::source_extend>_>::~vector
            ((vector<mjs::source_extend,_std::allocator<mjs::source_extend>_> *)(local_a0 + 0x28));
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)&param_extends.
                super__Vector_base<mjs::source_extend,_std::allocator<mjs::source_extend>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

auto parse_function() {
        const auto body_start = lexer_.text_position() - 1;
        EXPECT(token_type::lparen);
        std::vector<std::wstring> params;
        std::vector<source_extend> param_extends;
        if (!accept(token_type::rparen)) {
            do {
                param_extends.push_back(current_extend());
                params.push_back(EXPECT(token_type::identifier).text());
            } while (accept(token_type::comma));
            EXPECT(token_type::rparen);
        }
        scoped_strict_mode ssm{*this};   // Make sure state is restored afterwards
        auto block = parse_block(version_ >= version::es5);
        const auto body_end = block->extend().end;

        assert(block->type() == statement_type::block);
        if (static_cast<const block_statement&>(*block).strict_mode() && !skip_strict_checks_for_first_function_) {
            for (size_t i = 0; i < params.size(); ++i) {
                auto n = params[i];
                if (is_strict_mode_unassignable_identifier(n)) {
                    SYNTAX_ERROR_AT("\"" << cpp_quote(n) << "\" may not be used as a parameter name in strict mode", param_extends[i]);
                }
                if (std::find(params.begin() + i + 1, params.end(), n) != params.end()) {
                    SYNTAX_ERROR_AT("Parameter names may not be repeated in strict mode", param_extends[i]);
                }
            }
        }
        skip_strict_checks_for_first_function_ = false;

        return std::make_tuple(source_extend{source_, body_start, body_end}, std::move(params), std::move(block));
    }